

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

void __thiscall ImGuiInputTextState::OnKeyPressed(ImGuiInputTextState *this,int key)

{
  STB_TexteditState *state;
  ulong uVar1;
  ImWchar *pIVar2;
  float fVar3;
  uchar uVar4;
  short sVar5;
  undefined2 uVar6;
  undefined2 uVar7;
  undefined2 uVar8;
  undefined2 uVar9;
  unsigned_short *puVar10;
  float fVar11;
  StbUndoRecord *pSVar12;
  bool bVar13;
  ushort uVar14;
  int temp;
  int iVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  int n_3;
  uint uVar19;
  uint uVar20;
  int iVar21;
  int iVar22;
  long lVar23;
  ImStb *pIVar24;
  long lVar25;
  int n_1;
  ImGuiInputTextState *str;
  int *piVar26;
  int iVar27;
  ulong uVar28;
  undefined8 in_R8;
  bool bVar29;
  float fVar30;
  ImWchar *text_remaining;
  StbFindState find;
  ImWchar *local_50;
  ImWchar local_48 [6];
  int local_3c;
  int local_38;
  int local_34;
  
  state = &this->Stb;
  uVar4 = (this->Stb).single_line;
LAB_0034aa39:
  switch(key) {
  case 0x200000:
    goto switchD_0034aa4c_caseD_200000;
  case 0x200001:
    if ((this->Stb).select_start == (this->Stb).select_end) {
      (this->Stb).cursor = (this->Stb).cursor + 1;
      iVar15 = this->CurLenW;
    }
    else {
      ImStb::stb_textedit_move_to_last(this,state);
      iVar15 = this->CurLenW;
      iVar21 = (this->Stb).select_start;
      iVar16 = (this->Stb).select_end;
      if (iVar21 != iVar16) {
        if (iVar15 < iVar21) {
          (this->Stb).select_start = iVar15;
          iVar21 = iVar15;
        }
        if (iVar15 < iVar16) {
          (this->Stb).select_end = iVar15;
          iVar16 = iVar15;
        }
        if (iVar21 == iVar16) {
          state->cursor = iVar21;
        }
      }
    }
    if (iVar15 < state->cursor) goto LAB_0034b14b;
    goto LAB_0034b781;
  case 0x200002:
switchD_0034aa4c_caseD_200002:
    if (uVar4 == '\0') {
      uVar17 = (this->Stb).select_start;
      str = (ImGuiInputTextState *)(ulong)uVar17;
      uVar18 = (this->Stb).select_end;
      if ((key & 0x400000U) == 0) {
        if (uVar17 == uVar18) {
          str = (ImGuiInputTextState *)(ulong)(uint)state->cursor;
        }
        else {
          if ((int)uVar18 < (int)uVar17) {
            (this->Stb).select_start = uVar18;
            str = (ImGuiInputTextState *)(ulong)uVar18;
          }
          (this->Stb).cursor = (int)str;
          (this->Stb).select_end = (int)str;
          (this->Stb).has_preferred_x = '\0';
        }
LAB_0034b27b:
        uVar19 = this->CurLenW;
      }
      else {
        if (uVar17 == uVar18) {
          uVar17 = (this->Stb).cursor;
          str = (ImGuiInputTextState *)(ulong)uVar17;
          (this->Stb).select_end = uVar17;
          (this->Stb).select_start = uVar17;
          goto LAB_0034b27b;
        }
        (this->Stb).cursor = uVar18;
        uVar19 = this->CurLenW;
        if ((int)uVar19 < (int)uVar17) {
          (this->Stb).select_start = uVar19;
          str = (ImGuiInputTextState *)(ulong)uVar19;
        }
        uVar17 = uVar18;
        if ((int)uVar19 < (int)uVar18) {
          (this->Stb).select_end = uVar19;
          uVar17 = uVar19;
        }
        if ((uint)str == uVar17) {
          state->cursor = (uint)str;
        }
        else {
          str = (ImGuiInputTextState *)(ulong)uVar18;
        }
      }
      if ((int)uVar19 < (int)str) {
        state->cursor = uVar19;
        str = (ImGuiInputTextState *)(ulong)uVar19;
      }
      ImStb::stb_textedit_find_charpos((ImStb *)local_48,(StbFindState *)this,str,0,(int)in_R8);
      if (local_34 == local_3c) goto LAB_0034b785;
      pIVar24 = (ImStb *)&(this->Stb).preferred_x;
      if ((this->Stb).has_preferred_x == '\0') {
        pIVar24 = (ImStb *)local_48;
      }
      fVar3 = *(float *)pIVar24;
      (this->Stb).cursor = local_34;
      puVar10 = (this->TextW).Data;
      local_50 = (ImWchar *)0x0;
      pIVar2 = puVar10 + local_34;
      InputTextCalcTextSizeW(pIVar2,puVar10 + this->CurLenW,&local_50,(ImVec2 *)0x1,SUB81(in_R8,0));
      iVar15 = (int)((ulong)((long)local_50 - (long)pIVar2) >> 1);
      if (iVar15 < 1) goto LAB_0034b34a;
      iVar21 = 0;
      fVar11 = 0.0;
      goto LAB_0034b310;
    }
    key = key & 0x400000U | 0x200000;
    goto LAB_0034aa39;
  case 0x200003:
switchD_0034aa4c_caseD_200003:
    if (uVar4 != '\0') goto code_r0x0034aa8a;
    uVar17 = (this->Stb).select_start;
    uVar18 = (this->Stb).select_end;
    if ((key & 0x400000U) == 0) {
      if (uVar17 == uVar18) goto LAB_0034afe4;
      ImStb::stb_textedit_move_to_last(this,state);
      uVar17 = (this->Stb).select_start;
      uVar18 = (this->Stb).select_end;
LAB_0034b166:
      uVar19 = this->CurLenW;
      if (uVar17 != uVar18) {
        if ((int)uVar19 < (int)uVar17) {
          (this->Stb).select_start = uVar19;
          uVar17 = uVar19;
        }
        if ((int)uVar19 < (int)uVar18) {
          (this->Stb).select_end = uVar19;
          uVar18 = uVar19;
        }
        if (uVar17 == uVar18) {
          state->cursor = uVar17;
        }
      }
    }
    else {
      if (uVar17 != uVar18) {
        state->cursor = uVar18;
        goto LAB_0034b166;
      }
      iVar15 = (this->Stb).cursor;
      (this->Stb).select_end = iVar15;
      (this->Stb).select_start = iVar15;
LAB_0034afe4:
      uVar19 = this->CurLenW;
    }
    uVar17 = state->cursor;
    if ((int)uVar19 < state->cursor) {
      state->cursor = uVar19;
      uVar17 = uVar19;
    }
    ImStb::stb_textedit_find_charpos
              ((ImStb *)local_48,(StbFindState *)this,(ImGuiInputTextState *)(ulong)uVar17,
               (uint)(this->Stb).single_line,(int)in_R8);
    if ((long)local_38 == 0) goto LAB_0034b785;
    pIVar24 = (ImStb *)&(this->Stb).preferred_x;
    if ((this->Stb).has_preferred_x == '\0') {
      pIVar24 = (ImStb *)local_48;
    }
    fVar3 = *(float *)pIVar24;
    lVar23 = (long)local_3c + (long)local_38;
    iVar15 = (int)lVar23;
    (this->Stb).cursor = iVar15;
    puVar10 = (this->TextW).Data;
    local_50 = (ImWchar *)0x0;
    pIVar2 = puVar10 + lVar23;
    InputTextCalcTextSizeW(pIVar2,puVar10 + this->CurLenW,&local_50,(ImVec2 *)0x1,SUB81(in_R8,0));
    iVar21 = (int)((ulong)((long)local_50 - (long)pIVar2) >> 1);
    if (iVar21 < 1) goto LAB_0034b34a;
    fVar11 = 0.0;
    iVar16 = 0;
    goto LAB_0034b224;
  case 0x200004:
    uVar17 = this->CurLenW;
    uVar18 = (this->Stb).select_start;
    uVar19 = (this->Stb).select_end;
    uVar20 = uVar18;
    if (uVar18 != uVar19) {
      if ((int)uVar17 < (int)uVar18) {
        (this->Stb).select_start = uVar17;
        uVar18 = uVar17;
      }
      if ((int)uVar17 < (int)uVar19) {
        (this->Stb).select_end = uVar17;
        uVar19 = uVar17;
      }
      uVar20 = uVar19;
      if (uVar18 == uVar19) {
        state->cursor = uVar18;
        uVar20 = uVar18;
      }
    }
    uVar19 = state->cursor;
    if ((int)uVar17 < state->cursor) {
      state->cursor = uVar17;
      uVar19 = uVar17;
    }
    if (uVar18 != uVar20) {
      uVar19 = uVar18;
      if ((int)uVar20 < (int)uVar18) {
        (this->Stb).select_start = uVar20;
        uVar19 = uVar20;
      }
      (this->Stb).cursor = uVar19;
      (this->Stb).select_end = uVar19;
      (this->Stb).has_preferred_x = '\0';
    }
    if (uVar4 != '\0') {
      state->cursor = 0;
      goto LAB_0034b781;
    }
    if ((int)uVar19 < 1) goto LAB_0034b781;
    if ((this->TextW).Size < (int)uVar19) goto LAB_0034b7a5;
    puVar10 = (this->TextW).Data;
    uVar28 = (ulong)uVar19;
    goto LAB_0034b469;
  case 0x200005:
    iVar15 = this->CurLenW;
    iVar21 = (this->Stb).select_start;
    iVar16 = (this->Stb).select_end;
    iVar27 = iVar21;
    if (iVar21 != iVar16) {
      if (iVar15 < iVar21) {
        (this->Stb).select_start = iVar15;
        iVar21 = iVar15;
      }
      if (iVar15 < iVar16) {
        (this->Stb).select_end = iVar15;
        iVar16 = iVar15;
      }
      iVar27 = iVar16;
      if (iVar21 == iVar16) {
        state->cursor = iVar21;
        iVar27 = iVar21;
      }
    }
    iVar16 = state->cursor;
    if (iVar15 < state->cursor) {
      state->cursor = iVar15;
      iVar16 = iVar15;
    }
    if (iVar21 != iVar27) {
      iVar16 = iVar21;
      if (iVar27 < iVar21) {
        (this->Stb).select_start = iVar27;
        iVar16 = iVar27;
      }
      (this->Stb).cursor = iVar16;
      (this->Stb).select_end = iVar16;
      (this->Stb).has_preferred_x = '\0';
    }
    if (uVar4 != '\0') {
      state->cursor = iVar15;
      goto LAB_0034b781;
    }
    if (iVar15 <= iVar16) goto LAB_0034b781;
    iVar21 = (this->TextW).Size;
    if (iVar21 <= iVar16) {
      iVar21 = iVar16;
    }
    puVar10 = (this->TextW).Data;
    lVar23 = 0;
    goto LAB_0034b4b4;
  case 0x200006:
    (this->Stb).select_end = 0;
    (this->Stb).cursor = 0;
    (this->Stb).select_start = 0;
    goto LAB_0034b781;
  case 0x200007:
    (this->Stb).cursor = this->CurLenW;
    (this->Stb).select_start = 0;
    (this->Stb).select_end = 0;
    goto LAB_0034b781;
  case 0x200008:
switchD_0034aa4c_caseD_200008:
    if ((this->Stb).select_start == (this->Stb).select_end) {
      iVar15 = (this->Stb).cursor;
      if (iVar15 < this->CurLenW) {
        ImStb::stb_textedit_delete(this,state,iVar15,1);
      }
      goto LAB_0034b781;
    }
    break;
  case 0x200009:
switchD_0034aa4c_caseD_200009:
    if ((this->Stb).select_start == (this->Stb).select_end) {
      iVar15 = this->CurLenW;
      iVar21 = (this->Stb).cursor;
      if (iVar15 < iVar21) {
        state->cursor = iVar15;
        iVar21 = iVar15;
      }
      if (0 < iVar21) {
        ImStb::stb_textedit_delete(this,state,iVar21 + -1,1);
        (this->Stb).cursor = (this->Stb).cursor + -1;
      }
      goto LAB_0034b781;
    }
    break;
  case 0x20000a:
    lVar23 = (long)(this->Stb).undostate.undo_point;
    if (lVar23 == 0) goto LAB_0034b781;
    iVar15 = (this->Stb).undostate.undo_rec[lVar23 + -1].where;
    iVar21 = (this->Stb).undostate.undo_rec[lVar23 + -1].insert_length;
    uVar17 = (this->Stb).undostate.undo_rec[lVar23 + -1].delete_length;
    uVar28 = (ulong)(this->Stb).undostate.redo_point;
    iVar16 = (this->Stb).undostate.undo_rec[lVar23 + -1].char_storage;
    (this->Stb).undostate.undo_rec[uVar28 - 1].char_storage = -1;
    (this->Stb).undostate.undo_rec[uVar28 - 1].insert_length = uVar17;
    (this->Stb).undostate.undo_rec[uVar28 - 1].delete_length = iVar21;
    (this->Stb).undostate.undo_rec[uVar28 - 1].where = iVar15;
    if ((ulong)uVar17 == 0) goto LAB_0034b696;
    iVar27 = (this->Stb).undostate.undo_char_point;
    if ((int)(iVar27 + uVar17) < 999) {
      iVar22 = (this->Stb).undostate.redo_char_point;
      if (iVar22 < (int)(iVar27 + uVar17)) goto LAB_0034b547;
      goto LAB_0034b621;
    }
    (this->Stb).undostate.undo_rec[uVar28 - 1].insert_length = 0;
    goto LAB_0034b683;
  case 0x20000b:
    lVar23 = (long)(this->Stb).undostate.redo_point;
    if (lVar23 == 99) goto LAB_0034b781;
    sVar5 = (this->Stb).undostate.undo_point;
    iVar15 = (this->Stb).undostate.undo_rec[lVar23].where;
    iVar21 = (this->Stb).undostate.undo_rec[lVar23].insert_length;
    uVar17 = (this->Stb).undostate.undo_rec[lVar23].delete_length;
    iVar16 = (this->Stb).undostate.undo_rec[lVar23].char_storage;
    (this->Stb).undostate.undo_rec[sVar5].delete_length = iVar21;
    (this->Stb).undostate.undo_rec[sVar5].insert_length = uVar17;
    (this->Stb).undostate.undo_rec[sVar5].where = iVar15;
    (this->Stb).undostate.undo_rec[sVar5].char_storage = -1;
    if ((ulong)uVar17 == 0) goto LAB_0034b73a;
    iVar27 = (this->Stb).undostate.undo_char_point;
    if ((this->Stb).undostate.redo_char_point < (int)(iVar27 + uVar17)) {
      pSVar12 = (this->Stb).undostate.undo_rec + sVar5;
      pSVar12->insert_length = 0;
      pSVar12->delete_length = 0;
      goto LAB_0034b72f;
    }
    (this->Stb).undostate.undo_rec[sVar5].char_storage = iVar27;
    (this->Stb).undostate.undo_char_point = iVar27 + uVar17;
    if ((int)uVar17 < 1) goto LAB_0034b72f;
    iVar22 = (this->TextW).Size;
    if (iVar22 < iVar15) {
      iVar22 = iVar15;
    }
    puVar10 = (this->TextW).Data;
    uVar28 = 0;
    goto LAB_0034b714;
  case 0x20000c:
    iVar15 = (this->Stb).select_start;
    iVar21 = (this->Stb).select_end;
    bVar29 = SBORROW4(iVar15,iVar21);
    iVar16 = iVar15 - iVar21;
    bVar13 = iVar15 == iVar21;
    if (!bVar13) goto LAB_0034ad90;
    iVar15 = state->cursor;
    goto LAB_0034ad3a;
  case 0x20000d:
    if ((this->Stb).select_start != (this->Stb).select_end) {
      ImStb::stb_textedit_move_to_last(this,state);
      goto LAB_0034b785;
    }
    iVar15 = this->CurLenW;
    iVar21 = (this->Stb).cursor;
    goto LAB_0034adb6;
  default:
    switch(key) {
    case 0x600000:
      iVar15 = this->CurLenW;
      iVar16 = (this->Stb).select_start;
      iVar21 = (this->Stb).select_end;
      if (iVar16 == iVar21) {
        iVar16 = state->cursor;
LAB_0034b0de:
        iVar21 = iVar15;
        if (iVar16 < iVar15) {
          iVar21 = iVar16;
        }
        (this->Stb).select_end = iVar21;
        (this->Stb).select_start = iVar21;
      }
      else {
        if (iVar15 < iVar16) {
          (this->Stb).select_start = iVar15;
          iVar16 = iVar15;
        }
        if (iVar15 < iVar21) {
          (this->Stb).select_end = iVar15;
          iVar21 = iVar15;
        }
        if (iVar16 == iVar21) goto LAB_0034b0de;
      }
      if (0 < iVar21) {
        iVar21 = iVar21 + -1;
        (this->Stb).select_end = iVar21;
      }
      (this->Stb).cursor = iVar21;
      goto LAB_0034b781;
    case 0x600001:
      iVar15 = (this->Stb).select_start;
      iVar21 = (this->Stb).select_end;
      if (iVar15 == iVar21) {
        iVar15 = (this->Stb).cursor;
        (this->Stb).select_start = iVar15;
        iVar21 = iVar15;
      }
      iVar16 = iVar21 + 1;
      (this->Stb).select_end = iVar16;
      if (iVar15 != iVar16) {
        iVar27 = this->CurLenW;
        if (iVar27 < iVar15) {
          (this->Stb).select_start = iVar27;
        }
        iVar15 = iVar16;
        if (iVar27 <= iVar21) {
          (this->Stb).select_end = iVar27;
          iVar15 = iVar27;
        }
      }
      (this->Stb).cursor = iVar15;
      goto LAB_0034b781;
    case 0x600002:
      goto switchD_0034aa4c_caseD_200002;
    case 0x600003:
      goto switchD_0034aa4c_caseD_200003;
    case 0x600004:
      uVar17 = this->CurLenW;
      uVar18 = (this->Stb).select_start;
      uVar19 = (this->Stb).select_end;
      uVar20 = uVar18;
      if (uVar18 != uVar19) {
        if ((int)uVar17 < (int)uVar18) {
          (this->Stb).select_start = uVar17;
          uVar18 = uVar17;
        }
        if ((int)uVar17 < (int)uVar19) {
          (this->Stb).select_end = uVar17;
          uVar19 = uVar17;
        }
        uVar20 = uVar19;
        if (uVar18 == uVar19) {
          state->cursor = uVar18;
          uVar20 = uVar18;
        }
      }
      uVar19 = state->cursor;
      if ((int)uVar17 < state->cursor) {
        state->cursor = uVar17;
        uVar19 = uVar17;
      }
      if (uVar18 == uVar20) {
        (this->Stb).select_end = uVar19;
        (this->Stb).select_start = uVar19;
        uVar20 = uVar19;
      }
      else {
        state->cursor = uVar20;
      }
      uVar17 = 0;
      if (uVar4 != '\0') goto LAB_0034b0a0;
      if ((int)uVar20 < 1) goto LAB_0034b0a5;
      if ((this->TextW).Size < (int)uVar20) goto LAB_0034b7a5;
      puVar10 = (this->TextW).Data;
      uVar28 = (ulong)uVar20;
      if (puVar10[(ulong)uVar20 - 1] == 10) goto LAB_0034b0a5;
      goto LAB_0034b3eb;
    case 0x600005:
      iVar15 = this->CurLenW;
      iVar21 = (this->Stb).select_start;
      iVar16 = (this->Stb).select_end;
      iVar27 = iVar21;
      if (iVar21 != iVar16) {
        if (iVar15 < iVar21) {
          (this->Stb).select_start = iVar15;
          iVar21 = iVar15;
        }
        if (iVar15 < iVar16) {
          (this->Stb).select_end = iVar15;
          iVar16 = iVar15;
        }
        iVar27 = iVar16;
        if (iVar21 == iVar16) {
          state->cursor = iVar21;
          iVar27 = iVar21;
        }
      }
      iVar16 = state->cursor;
      if (iVar15 < state->cursor) {
        state->cursor = iVar15;
        iVar16 = iVar15;
      }
      if (iVar21 == iVar27) {
        (this->Stb).select_end = iVar16;
        (this->Stb).select_start = iVar16;
        iVar27 = iVar16;
      }
      else {
        state->cursor = iVar27;
      }
      if (uVar4 != '\0') {
        state->cursor = iVar15;
        iVar27 = iVar15;
        goto LAB_0034b77e;
      }
      if (iVar15 <= iVar27) goto LAB_0034b77e;
      iVar21 = (this->TextW).Size;
      lVar23 = (long)iVar27;
      iVar16 = iVar27;
      if (iVar27 < iVar21) {
        iVar16 = iVar21;
      }
      puVar10 = (this->TextW).Data;
      goto LAB_0034b425;
    case 0x600006:
      if ((this->Stb).select_start == (this->Stb).select_end) {
        (this->Stb).select_start = (this->Stb).cursor;
      }
      iVar15 = 0;
      break;
    case 0x600007:
      if ((this->Stb).select_start == (this->Stb).select_end) {
        (this->Stb).select_start = (this->Stb).cursor;
      }
      iVar15 = this->CurLenW;
      break;
    case 0x600008:
      goto switchD_0034aa4c_caseD_200008;
    case 0x600009:
      goto switchD_0034aa4c_caseD_200009;
    default:
      uVar28 = 0;
      if (key < 0x10000) {
        uVar28 = (ulong)(uint)key;
      }
      iVar15 = (int)uVar28;
      if (iVar15 < 1) goto LAB_0034b785;
      local_48[0] = (ImWchar)uVar28;
      if (iVar15 == 10 && uVar4 != '\0') goto LAB_0034b785;
      if ((((this->Stb).insert_mode == '\0') || ((this->Stb).select_start != (this->Stb).select_end)
          ) || (iVar21 = (this->Stb).cursor, this->CurLenW <= iVar21)) {
        ImStb::stb_textedit_delete_selection(this,state);
        bVar13 = ImStb::STB_TEXTEDIT_INSERTCHARS(this,(this->Stb).cursor,local_48,1);
        if (!bVar13) goto LAB_0034b785;
        ImStb::stb_text_createundo(&(this->Stb).undostate,(this->Stb).cursor,0,1);
      }
      else {
        ImStb::stb_text_makeundo_replace
                  (this,state,iVar21,
                   (int)CONCAT71((int7)(uVar28 >> 8),iVar15 != 10 || uVar4 == '\0'),(int)in_R8);
        ImStb::STB_TEXTEDIT_DELETECHARS(this,(this->Stb).cursor,1);
        bVar13 = ImStb::STB_TEXTEDIT_INSERTCHARS(this,(this->Stb).cursor,local_48,1);
        if (!bVar13) goto LAB_0034b785;
      }
      (this->Stb).cursor = (this->Stb).cursor + 1;
      goto LAB_0034b781;
    case 0x60000c:
      iVar15 = (this->Stb).cursor;
      if ((this->Stb).select_start == (this->Stb).select_end) {
        (this->Stb).select_end = iVar15;
        (this->Stb).select_start = iVar15;
      }
      goto LAB_0034abe6;
    case 0x60000d:
      iVar15 = (this->Stb).cursor;
      if ((this->Stb).select_start == (this->Stb).select_end) {
        (this->Stb).select_end = iVar15;
        (this->Stb).select_start = iVar15;
      }
      iVar21 = this->CurLenW;
      goto LAB_0034ac88;
    }
    (this->Stb).select_end = iVar15;
    (this->Stb).cursor = iVar15;
    goto LAB_0034b781;
  }
  ImStb::stb_textedit_delete_selection(this,state);
  goto LAB_0034b781;
  while (iVar16 = ImStb::is_word_boundary_from_right(this,iVar15), iVar16 == 0) {
LAB_0034ac88:
    iVar15 = iVar15 + 1;
    if (iVar21 <= iVar15) break;
  }
  if (iVar15 < iVar21) {
    iVar21 = iVar15;
  }
  (this->Stb).cursor = iVar21;
  (this->Stb).select_end = iVar21;
  iVar15 = this->CurLenW;
  iVar16 = (this->Stb).select_start;
  if (iVar16 != iVar21) {
    if (iVar15 < iVar16) {
      (this->Stb).select_start = iVar15;
      iVar16 = iVar15;
    }
    iVar27 = iVar21;
    if (iVar15 < iVar21) {
      (this->Stb).select_end = iVar15;
      iVar27 = iVar15;
    }
    if (iVar16 == iVar27) {
      state->cursor = iVar16;
      iVar21 = iVar16;
    }
  }
  if (iVar21 <= iVar15) goto LAB_0034b785;
  goto LAB_0034acde;
  while (iVar16 = ImStb::is_word_boundary_from_right(this,iVar21), iVar15 = iVar21, iVar16 == 0) {
LAB_0034abe6:
    iVar21 = iVar15 + -1;
    if (iVar15 < 1) break;
  }
  iVar16 = 0;
  if (0 < iVar21) {
    iVar16 = iVar21;
  }
  (this->Stb).cursor = iVar16;
  (this->Stb).select_end = iVar16;
  iVar15 = this->CurLenW;
  iVar21 = (this->Stb).select_start;
  if (iVar21 != iVar16) {
    if (iVar15 < iVar21) {
      (this->Stb).select_start = iVar15;
      iVar21 = iVar15;
    }
    iVar27 = iVar16;
    if (iVar15 < iVar16) {
      (this->Stb).select_end = iVar15;
      iVar27 = iVar15;
    }
    if (iVar21 == iVar27) {
      state->cursor = iVar21;
      iVar16 = iVar21;
    }
  }
  if (iVar16 <= iVar15) goto LAB_0034b785;
LAB_0034acde:
  state->cursor = iVar15;
  goto LAB_0034b785;
  while( true ) {
    lVar23 = lVar23 + 1;
    state->cursor = iVar27 + 1;
    iVar27 = iVar15;
    if (iVar15 == (int)lVar23) break;
LAB_0034b425:
    if (iVar16 == lVar23) goto LAB_0034b7a5;
    iVar27 = (int)lVar23;
    if (puVar10[lVar23] == 10) break;
  }
LAB_0034b77e:
  (this->Stb).select_end = iVar27;
  goto LAB_0034b781;
  while (uVar1 = uVar28 - 1, lVar23 = uVar28 - 2, uVar28 = uVar1, puVar10[lVar23] != 10) {
LAB_0034b3eb:
    if (uVar28 < 2) goto LAB_0034b0a0;
  }
  uVar17 = (uint)uVar1;
LAB_0034b0a0:
  uVar20 = uVar17;
  state->cursor = uVar20;
LAB_0034b0a5:
  (this->Stb).select_end = uVar20;
  goto LAB_0034b781;
  while (iVar16 = ImStb::is_word_boundary_from_right(this,iVar21), iVar16 == 0) {
LAB_0034adb6:
    iVar21 = iVar21 + 1;
    if (iVar15 <= iVar21) break;
  }
  if (iVar21 < iVar15) {
    iVar15 = iVar21;
  }
  (this->Stb).cursor = iVar15;
  goto LAB_0034adda;
  while (iVar16 = ImStb::is_word_boundary_from_right(this,iVar21), iVar15 = iVar21, iVar16 == 0) {
LAB_0034ad3a:
    iVar21 = iVar15 + -1;
    if (iVar15 < 1) break;
  }
  iVar15 = 0;
  if (0 < iVar21) {
    iVar15 = iVar21;
  }
  (this->Stb).cursor = iVar15;
LAB_0034adda:
  ImStb::stb_textedit_clamp((ImGuiInputTextState *)(ulong)(uint)this->CurLenW,state);
  goto LAB_0034b785;
  while( true ) {
    (this->Stb).undostate.undo_char[(long)iVar27 + uVar28] = puVar10[(long)iVar15 + uVar28];
    uVar28 = uVar28 + 1;
    if (uVar17 == uVar28) break;
LAB_0034b714:
    if ((uint)(iVar22 - iVar15) == uVar28) goto LAB_0034b7a5;
  }
LAB_0034b72f:
  ImStb::STB_TEXTEDIT_DELETECHARS(this,iVar15,uVar17);
LAB_0034b73a:
  if (iVar21 != 0) {
    ImStb::STB_TEXTEDIT_INSERTCHARS(this,iVar15,(this->Stb).undostate.undo_char + iVar16,iVar21);
    piVar26 = &(this->Stb).undostate.redo_char_point;
    *piVar26 = *piVar26 + iVar21;
  }
  (this->Stb).cursor = iVar21 + iVar15;
  uVar7 = (this->Stb).undostate.undo_point;
  uVar9 = (this->Stb).undostate.redo_point;
  (this->Stb).undostate.undo_point = uVar7 + 1;
  (this->Stb).undostate.redo_point = uVar9 + 1;
  goto LAB_0034b781;
LAB_0034b547:
  do {
    uVar14 = (ushort)uVar28;
    if (uVar14 == 99) goto LAB_0034b781;
    if ((short)uVar14 < 99) {
      if ((this->Stb).undostate.undo_rec[0x62].char_storage < 0) {
LAB_0034b5cb:
        if ((short)uVar14 < 0) {
          __assert_fail("((char*)(state->undo_rec + state->redo_point)) >= buf_begin",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/imgui/include/imstb_textedit.h"
                        ,0x475,"void ImStb::stb_textedit_discard_redo(StbUndoState *)");
        }
      }
      else {
        iVar27 = (this->Stb).undostate.undo_rec[0x62].insert_length;
        iVar22 = iVar22 + iVar27;
        (this->Stb).undostate.redo_char_point = iVar22;
        pIVar2 = (this->Stb).undostate.undo_char + iVar22;
        memmove(pIVar2,pIVar2 + -(long)iVar27,(long)(999 - iVar22) * 2);
        uVar14 = (this->Stb).undostate.redo_point;
        lVar23 = (long)(short)uVar14;
        if (lVar23 < 0x62) {
          lVar25 = lVar23 + -0x62;
          piVar26 = &(this->Stb).undostate.undo_rec[lVar23].char_storage;
          do {
            if (-1 < *piVar26) {
              *piVar26 = *piVar26 + iVar27;
            }
            piVar26 = piVar26 + 4;
            lVar25 = lVar25 + 1;
          } while (lVar25 != 0);
          goto LAB_0034b5cb;
        }
      }
      uVar28 = (ulong)uVar14;
      memmove((this->Stb).undostate.undo_rec + uVar28 + 1,(this->Stb).undostate.undo_rec + uVar28,
              uVar28 * -0x10 + 0x620);
      iVar27 = (this->Stb).undostate.undo_char_point;
      uVar18 = *(int *)&(this->Stb).undostate.redo_point + 1;
      uVar28 = (ulong)uVar18;
      (this->Stb).undostate.redo_point = (short)uVar18;
      iVar22 = (this->Stb).undostate.redo_char_point;
    }
  } while (iVar22 < (int)(uVar17 + iVar27));
  uVar28 = (ulong)(short)uVar28;
LAB_0034b621:
  (this->Stb).undostate.undo_rec[uVar28 - 1].char_storage = iVar22 - uVar17;
  (this->Stb).undostate.redo_char_point = iVar22 - uVar17;
  if (0 < (int)uVar17) {
    iVar27 = (this->TextW).Size;
    if (iVar27 < iVar15) {
      iVar27 = iVar15;
    }
    puVar10 = (this->TextW).Data;
    uVar28 = 0;
    do {
      if ((uint)(iVar27 - iVar15) == uVar28) goto LAB_0034b7a5;
      *(unsigned_short *)
       ((long)this + uVar28 * 2 + (long)iVar22 * 2 + (long)(int)uVar17 * -2 + 0x694) =
           puVar10[(long)iVar15 + uVar28];
      uVar28 = uVar28 + 1;
    } while (uVar17 != uVar28);
  }
LAB_0034b683:
  ImStb::STB_TEXTEDIT_DELETECHARS(this,iVar15,uVar17);
LAB_0034b696:
  if (iVar21 != 0) {
    ImStb::STB_TEXTEDIT_INSERTCHARS(this,iVar15,(this->Stb).undostate.undo_char + iVar16,iVar21);
    piVar26 = &(this->Stb).undostate.undo_char_point;
    *piVar26 = *piVar26 - iVar21;
  }
  (this->Stb).cursor = iVar21 + iVar15;
  uVar6 = (this->Stb).undostate.undo_point;
  uVar8 = (this->Stb).undostate.redo_point;
  (this->Stb).undostate.undo_point = uVar6 + -1;
  (this->Stb).undostate.redo_point = uVar8 + -1;
  goto LAB_0034b781;
  while( true ) {
    state->cursor = iVar16 + 1 + (int)lVar23;
    lVar23 = lVar23 + 1;
    if (iVar15 - iVar16 == (int)lVar23) break;
LAB_0034b4b4:
    if ((long)iVar21 - (long)iVar16 == lVar23) {
LAB_0034b7a5:
      __assert_fail("i < Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/imgui/include/imgui.h"
                    ,0x4e1,
                    "const T &ImVector<unsigned short>::operator[](int) const [T = unsigned short]")
      ;
    }
    if (puVar10[iVar16 + lVar23] == 10) break;
  }
  goto LAB_0034b781;
code_r0x0034aa8a:
  key = key & 0x400000U | 0x200001;
  goto LAB_0034aa39;
  while( true ) {
    state->cursor = state->cursor + 1;
    iVar16 = iVar16 + 1;
    if (iVar21 == iVar16) break;
LAB_0034b224:
    fVar30 = ImStb::STB_TEXTEDIT_GETWIDTH(this,iVar15,iVar16);
    if (((fVar30 == -1.0) && (!NAN(fVar30))) || (fVar11 = fVar11 + fVar30, fVar3 < fVar11)) break;
  }
  goto LAB_0034b34a;
  while( true ) {
    state->cursor = state->cursor + 1;
    iVar21 = iVar21 + 1;
    if (iVar15 == iVar21) break;
LAB_0034b310:
    fVar30 = ImStb::STB_TEXTEDIT_GETWIDTH(this,local_34,iVar21);
    if (((fVar30 == -1.0) && (!NAN(fVar30))) || (fVar11 = fVar11 + fVar30, fVar3 < fVar11)) break;
  }
LAB_0034b34a:
  iVar15 = this->CurLenW;
  iVar21 = (this->Stb).select_start;
  iVar16 = (this->Stb).select_end;
  if (iVar21 != iVar16) {
    if (iVar15 < iVar21) {
      (this->Stb).select_start = iVar15;
      iVar21 = iVar15;
    }
    if (iVar15 < iVar16) {
      (this->Stb).select_end = iVar15;
      iVar16 = iVar15;
    }
    if (iVar21 == iVar16) {
      state->cursor = iVar21;
    }
  }
  iVar21 = state->cursor;
  if (iVar15 < state->cursor) {
    state->cursor = iVar15;
    iVar21 = iVar15;
  }
  (this->Stb).has_preferred_x = '\x01';
  (this->Stb).preferred_x = fVar3;
  if ((key & 0x400000U) != 0) {
    (this->Stb).select_end = iVar21;
  }
  goto LAB_0034b785;
switchD_0034aa4c_caseD_200000:
  iVar15 = (this->Stb).select_start;
  iVar21 = (this->Stb).select_end;
  bVar29 = SBORROW4(iVar15,iVar21);
  iVar16 = iVar15 - iVar21;
  bVar13 = iVar15 == iVar21;
  if (bVar13) {
    if (0 < state->cursor) {
      iVar15 = state->cursor + -1;
LAB_0034b14b:
      state->cursor = iVar15;
    }
  }
  else {
LAB_0034ad90:
    if (!bVar13 && bVar29 == iVar16 < 0) {
      (this->Stb).select_start = iVar21;
      iVar15 = iVar21;
    }
    (this->Stb).cursor = iVar15;
    (this->Stb).select_end = iVar15;
  }
  goto LAB_0034b781;
  while( true ) {
    state->cursor = (int)uVar28 + -1;
    bVar13 = uVar28 < 2;
    uVar28 = uVar28 - 1;
    if (bVar13) break;
LAB_0034b469:
    if (puVar10[uVar28 - 1] == 10) break;
  }
LAB_0034b781:
  (this->Stb).has_preferred_x = '\0';
LAB_0034b785:
  this->CursorFollow = true;
  this->CursorAnim = -0.3;
  return;
}

Assistant:

void ImGuiInputTextState::OnKeyPressed(int key)
{
    stb_textedit_key(this, &Stb, key);
    CursorFollow = true;
    CursorAnimReset();
}